

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3LocateTable(Parse *pParse,u32 flags,char *zName,char *zDbase)

{
  sqlite3 *psVar1;
  sqlite3_module *psVar2;
  bool bVar3;
  int iVar4;
  Table *pTVar5;
  HashElem *pHVar6;
  Module *pMod;
  char *pcVar7;
  char *pcVar8;
  Table *unaff_RBX;
  Table *local_40;
  sqlite3_module *local_38;
  
  iVar4 = sqlite3ReadSchema(pParse);
  if (iVar4 != 0) {
    return (Table *)0x0;
  }
  pTVar5 = sqlite3FindTable(pParse->db,zName,zDbase);
  if (pTVar5 != (Table *)0x0) {
    return pTVar5;
  }
  pcVar8 = "no such view";
  if ((flags & 1) == 0) {
    pcVar8 = "no such table";
  }
  psVar1 = pParse->db;
  iVar4 = sqlite3FindDbName(psVar1,zDbase);
  if (iVar4 < 1) {
    pHVar6 = findElementWithHash(&psVar1->aModule,zName,(uint *)0x0);
    pMod = (Module *)pHVar6->data;
    if (pMod == (Module *)0x0) {
      iVar4 = sqlite3_strnicmp(zName,"pragma_",7);
      if (iVar4 == 0) {
        pMod = sqlite3PragmaVtabRegister(psVar1,zName);
      }
      else {
        pMod = (Module *)0x0;
      }
    }
    bVar3 = true;
    if (pMod != (Module *)0x0) {
      psVar2 = pMod->pModule;
      local_40 = (Table *)0x0;
      if (pMod->pEpoTab == (Table *)0x0) {
        psVar1 = pParse->db;
        if (((psVar2->xCreate ==
              (_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *)
              0x0) || (psVar2->xCreate == psVar2->xConnect)) &&
           (local_38 = psVar2, pTVar5 = (Table *)sqlite3DbMallocZero(psVar1,0x80),
           pTVar5 != (Table *)0x0)) {
          pcVar7 = sqlite3DbStrDup(psVar1,pMod->zName);
          pTVar5->zName = pcVar7;
          if (pcVar7 == (char *)0x0) {
            sqlite3DbFreeNN(psVar1,pTVar5);
            unaff_RBX = pTVar5;
          }
          else {
            pMod->pEpoTab = pTVar5;
            pTVar5->nTabRef = 1;
            pTVar5->pSchema = psVar1->aDb->pSchema;
            pTVar5->iPKey = -1;
            pcVar7 = sqlite3DbStrDup(psVar1,pcVar7);
            addModuleArgument(psVar1,pTVar5,pcVar7);
            addModuleArgument(psVar1,pTVar5,(char *)0x0);
            pcVar7 = sqlite3DbStrDup(psVar1,pTVar5->zName);
            addModuleArgument(psVar1,pTVar5,pcVar7);
            iVar4 = vtabCallConstructor(psVar1,pTVar5,pMod,local_38->xConnect,(char **)&local_40);
            unaff_RBX = local_40;
            if (iVar4 == 0) goto LAB_001f4ca3;
            sqlite3ErrorMsg(pParse,"%s",local_40);
            if (unaff_RBX != (Table *)0x0) {
              sqlite3DbFreeNN(psVar1,unaff_RBX);
            }
            pTVar5 = pMod->pEpoTab;
            if (pTVar5 != (Table *)0x0) {
              *(byte *)&pTVar5->tabFlags = (byte)pTVar5->tabFlags | 2;
              sqlite3DeleteTable(psVar1,pTVar5);
              pMod->pEpoTab = (Table *)0x0;
            }
          }
        }
      }
      else {
LAB_001f4ca3:
        bVar3 = false;
        unaff_RBX = pMod->pEpoTab;
      }
    }
    if (!bVar3) {
      bVar3 = false;
      goto LAB_001f4e61;
    }
  }
  bVar3 = true;
  if ((flags & 2) == 0) {
    if (zDbase == (char *)0x0) {
      sqlite3ErrorMsg(pParse,"%s: %s",pcVar8,zName);
    }
    else {
      sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar8,zDbase,zName);
    }
    pParse->checkSchema = '\x01';
  }
LAB_001f4e61:
  if (bVar3) {
    return (Table *)0x0;
  }
  return unaff_RBX;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  u32 flags,             /* LOCATE_VIEW or LOCATE_NOERR */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return 0;
  }

  p = sqlite3FindTable(pParse->db, zName, zDbase);
  if( p==0 ){
    const char *zMsg = flags & LOCATE_VIEW ? "no such view" : "no such table";
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( sqlite3FindDbName(pParse->db, zDbase)<1 ){
      /* If zName is the not the name of a table in the schema created using
      ** CREATE, then check to see if it is the name of an virtual table that
      ** can be an eponymous virtual table. */
      Module *pMod = (Module*)sqlite3HashFind(&pParse->db->aModule, zName);
      if( pMod==0 && sqlite3_strnicmp(zName, "pragma_", 7)==0 ){
        pMod = sqlite3PragmaVtabRegister(pParse->db, zName);
      }
      if( pMod && sqlite3VtabEponymousTableInit(pParse, pMod) ){
        return pMod->pEpoTab;
      }
    }
#endif
    if( (flags & LOCATE_NOERR)==0 ){
      if( zDbase ){
        sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
      }else{
        sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
      }
      pParse->checkSchema = 1;
    }
  }

  return p;
}